

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertiesIterator.h
# Opt level: O1

void __thiscall
Rml::PropertiesIterator::PropertiesIterator
          (PropertiesIterator *this,PropertyIt it_style,PropertyIt it_style_end,
          PropertyIt it_definition,PropertyIt it_definition_end)

{
  bool bVar1;
  NodePtr pDVar2;
  PropertyId id;
  
  pDVar2 = it_style.mKeyVals;
  (this->iterated_properties).defined_ids.super__Base_bitset<2UL>._M_w[0] = 0;
  (this->iterated_properties).defined_ids.super__Base_bitset<2UL>._M_w[1] = 0;
  (this->it_style).mKeyVals = pDVar2;
  (this->it_style).mInfo = it_style.mInfo;
  (this->it_style_end).mKeyVals = it_style_end.mKeyVals;
  (this->it_style_end).mInfo = it_style_end.mInfo;
  (this->it_definition).mKeyVals = it_definition.mKeyVals;
  (this->it_definition).mInfo = it_definition.mInfo;
  (this->it_definition_end).mKeyVals = it_definition_end.mKeyVals;
  (this->it_definition_end).mInfo = it_definition_end.mInfo;
  this->at_end = false;
  if (pDVar2 != it_style_end.mKeyVals) {
    do {
      id = (pDVar2->mData).first;
      bVar1 = ::std::bitset<128UL>::test((bitset<128UL> *)this,(ulong)id);
      if (!bVar1) goto LAB_0023177b;
      robin_hood::detail::
      Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
      ::Iter<true>::operator++(&this->it_style);
      pDVar2 = (this->it_style).mKeyVals;
    } while (pDVar2 != (this->it_style_end).mKeyVals);
  }
  while( true ) {
    pDVar2 = (this->it_definition).mKeyVals;
    if (pDVar2 == (this->it_definition_end).mKeyVals) {
      this->at_end = true;
      return;
    }
    id = (pDVar2->mData).first;
    bVar1 = ::std::bitset<128UL>::test((bitset<128UL> *)this,(ulong)id);
    if (!bVar1) break;
    robin_hood::detail::
    Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
    ::Iter<true>::operator++(&this->it_definition);
  }
LAB_0023177b:
  PropertyIdSet::Insert(&this->iterated_properties,id);
  return;
}

Assistant:

PropertiesIterator(PropertyIt it_style, PropertyIt it_style_end, PropertyIt it_definition, PropertyIt it_definition_end) :
		it_style(it_style), it_style_end(it_style_end), it_definition(it_definition), it_definition_end(it_definition_end)
	{
		ProceedToNextValid();
	}